

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::DefaultTextureImageLoaderFunction
               (AssetPath *assetPath,AssetInfo *assetInfo,AssetResolutionResolver *assetResolver,
               TextureImage *texImageOut,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *imageData,void *userdata,
               string *warn,string *err)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  uint8_t *addr;
  size_t sz;
  value_type *pvVar4;
  PixelFormat fmt;
  string local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  value_type *local_2a0;
  value_type *imgret;
  TextureImage texImage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  string local_168 [32];
  fmt local_148 [39];
  undefined1 local_121;
  undefined1 local_120 [7];
  bool ret;
  Asset asset;
  string local_a0 [32];
  fmt local_80 [32];
  undefined1 local_60 [8];
  string resolvedPath;
  void *userdata_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *imageData_local;
  TextureImage *texImageOut_local;
  AssetResolutionResolver *assetResolver_local;
  AssetInfo *assetInfo_local;
  AssetPath *assetPath_local;
  
  resolvedPath.field_2._8_8_ = userdata;
  if (texImageOut == (TextureImage *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)err,"`imageOut` argument is nullptr\n");
    }
    return false;
  }
  if (imageData == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)err,"`imageData` argument is nullptr\n");
    }
    return false;
  }
  psVar2 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(assetPath);
  AssetResolutionResolver::resolve((string *)local_60,assetResolver,psVar2);
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    if (err != (string *)0x0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_a0,"Failed to resolve asset path: {}\n",
                 (allocator *)
                 ((long)&asset.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      psVar2 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(assetPath);
      tinyusdz::fmt::format<std::__cxx11::string>
                (local_80,(string *)local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_80);
      ::std::__cxx11::string::~string((string *)local_80);
      ::std::__cxx11::string::~string(local_a0);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&asset.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
    }
    assetPath_local._7_1_ = false;
    asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_004c2ee0;
  }
  Asset::Asset((Asset *)local_120);
  psVar2 = tinyusdz::value::AssetPath::GetAssetPath_abi_cxx11_(assetPath);
  local_121 = AssetResolutionResolver::open_asset
                        (assetResolver,(string *)local_60,psVar2,(Asset *)local_120,warn,err);
  if ((bool)local_121) {
    addr = Asset::data((Asset *)local_120);
    sz = Asset::size((Asset *)local_120);
    image::LoadImageFromMemory
              ((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_208,addr,sz,(string *)local_60);
    bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_208);
    if (bVar1) {
      TextureImage::TextureImage((TextureImage *)&imgret);
      ::std::__cxx11::string::operator=((string *)&imgret,(string *)local_60);
      pvVar4 = nonstd::expected_lite::
               expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_208);
      texImage.width = (pvVar4->image).channels;
      local_2a0 = nonstd::expected_lite::
                  expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::value((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_208);
      if ((local_2a0->image).bpp == 8) {
        texImage.asset_identifier.field_2._12_4_ = 0;
LAB_004c2e43:
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_208);
        texImage.width = (pvVar4->image).channels;
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_208);
        texImage.colorSpace = (pvVar4->image).width;
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_208);
        texImage.usdColorSpace = (pvVar4->image).height;
        TextureImage::operator=(texImageOut,(TextureImage *)&imgret);
        pvVar4 = nonstd::expected_lite::
                 expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_208);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (imageData,&(pvVar4->image).data);
        assetPath_local._7_1_ = true;
      }
      else {
        if ((local_2a0->image).bpp == 0x10) {
          if ((local_2a0->image).format == UInt) {
            texImage.asset_identifier.field_2._12_4_ = 2;
          }
          else if ((local_2a0->image).format == Int) {
            texImage.asset_identifier.field_2._12_4_ = 3;
          }
          else {
            if ((local_2a0->image).format != Float) {
              if (err != (string *)0x0) {
                tinyusdz::to_string_abi_cxx11_
                          (&local_300,(tinyusdz *)(ulong)(local_2a0->image).format,fmt);
                ::std::operator+((char *)&local_2e0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Invalid image.pixelformat: ");
                ::std::operator+(&local_2c0,&local_2e0,"\n");
                ::std::__cxx11::string::operator+=((string *)err,(string *)&local_2c0);
                ::std::__cxx11::string::~string((string *)&local_2c0);
                ::std::__cxx11::string::~string((string *)&local_2e0);
                ::std::__cxx11::string::~string((string *)&local_300);
              }
              assetPath_local._7_1_ = false;
              goto LAB_004c2ebc;
            }
            texImage.asset_identifier.field_2._12_4_ = 6;
          }
          goto LAB_004c2e43;
        }
        if ((local_2a0->image).bpp == 0x10) {
          if ((local_2a0->image).format == UInt) {
            texImage.asset_identifier.field_2._12_4_ = 4;
          }
          else if ((local_2a0->image).format == Int) {
            texImage.asset_identifier.field_2._12_4_ = 5;
          }
          else {
            if ((local_2a0->image).format != Float) {
              if (err != (string *)0x0) {
                tinyusdz::to_string_abi_cxx11_
                          (&local_360,(tinyusdz *)(ulong)(local_2a0->image).format,fmt);
                ::std::operator+((char *)&local_340,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)"Invalid image.pixelformat: ");
                ::std::operator+(&local_320,&local_340,"\n");
                ::std::__cxx11::string::operator+=((string *)err,(string *)&local_320);
                ::std::__cxx11::string::~string((string *)&local_320);
                ::std::__cxx11::string::~string((string *)&local_340);
                ::std::__cxx11::string::~string((string *)&local_360);
              }
              assetPath_local._7_1_ = false;
              goto LAB_004c2ebc;
            }
            texImage.asset_identifier.field_2._12_4_ = 7;
          }
          goto LAB_004c2e43;
        }
        if (err != (string *)0x0) {
          pvVar4 = nonstd::expected_lite::
                   expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::value((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_208);
          ::std::__cxx11::to_string(&local_3c0,(pvVar4->image).bpp);
          ::std::operator+((char *)&local_3a0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "TODO or unsupported bpp: ");
          ::std::operator+(&local_380,&local_3a0,"\n");
          ::std::__cxx11::string::operator+=((string *)err,(string *)&local_380);
          ::std::__cxx11::string::~string((string *)&local_380);
          ::std::__cxx11::string::~string((string *)&local_3a0);
          ::std::__cxx11::string::~string((string *)&local_3c0);
        }
        assetPath_local._7_1_ = false;
      }
LAB_004c2ebc:
      asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      TextureImage::~TextureImage((TextureImage *)&imgret);
    }
    else {
      if (err != (string *)0x0) {
        nonstd::expected_lite::
        expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::error((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_208);
        ::std::operator+((char *)&texImage.handle,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Failed to load image file: ");
        ::std::operator+(&local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &texImage.handle,"\n");
        ::std::__cxx11::string::operator+=((string *)err,(string *)&local_228);
        ::std::__cxx11::string::~string((string *)&local_228);
        ::std::__cxx11::string::~string((string *)&texImage.handle);
      }
      assetPath_local._7_1_ = false;
      asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    }
    nonstd::expected_lite::
    expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected((expected<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_208);
  }
  else {
    if (err != (string *)0x0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_168,"Failed to open asset: {}",
                 (allocator *)
                 &result.contained.
                  super_storage_t_impl<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0x97);
      tinyusdz::fmt::format<std::__cxx11::string>
                (local_148,(string *)local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      ::std::__cxx11::string::operator+=((string *)err,(string *)local_148);
      ::std::__cxx11::string::~string((string *)local_148);
      ::std::__cxx11::string::~string(local_168);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 &result.contained.
                  super_storage_t_impl<tinyusdz::image::ImageResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .field_0x97);
    }
    assetPath_local._7_1_ = false;
    asset.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  Asset::~Asset((Asset *)local_120);
LAB_004c2ee0:
  ::std::__cxx11::string::~string((string *)local_60);
  return assetPath_local._7_1_;
}

Assistant:

bool DefaultTextureImageLoaderFunction(
    const value::AssetPath &assetPath, const AssetInfo &assetInfo,
    const AssetResolutionResolver &assetResolver, TextureImage *texImageOut,
    std::vector<uint8_t> *imageData, void *userdata, std::string *warn,
    std::string *err) {
  if (!texImageOut) {
    if (err) {
      (*err) = "`imageOut` argument is nullptr\n";
    }
    return false;
  }

  if (!imageData) {
    if (err) {
      (*err) = "`imageData` argument is nullptr\n";
    }
    return false;
  }

  // TODO: assetInfo
  (void)assetInfo;
  (void)userdata;
  (void)warn;

  std::string resolvedPath = assetResolver.resolve(assetPath.GetAssetPath());

  if (resolvedPath.empty()) {
    if (err) {
      (*err) += fmt::format("Failed to resolve asset path: {}\n",
                            assetPath.GetAssetPath());
    }
    return false;
  }

  Asset asset;
  bool ret = assetResolver.open_asset(resolvedPath, assetPath.GetAssetPath(),
                                      &asset, warn, err);
  if (!ret) {
    if (err) {
      (*err) += fmt::format("Failed to open asset: {}", resolvedPath);
    }
    return false;
  }

  DCOUT("Resolved asset path = " << resolvedPath);

  // TODO: user-defined image loader handler.
  auto result = tinyusdz::image::LoadImageFromMemory(asset.data(), asset.size(),
                                                     resolvedPath);
  if (!result) {
    if (err) {
      (*err) += "Failed to load image file: " + result.error() + "\n";
    }
    return false;
  }

  TextureImage texImage;

  texImage.asset_identifier = resolvedPath;
  texImage.channels = result.value().image.channels;

  const auto &imgret = result.value();

  if (imgret.image.bpp == 8) {
    // assume uint8
    texImage.assetTexelComponentType = ComponentType::UInt8;
  } else if (imgret.image.bpp == 16) {
    if (imgret.image.format == Image::PixelFormat::UInt) {
      texImage.assetTexelComponentType = ComponentType::UInt16;
    } else if (imgret.image.format == Image::PixelFormat::Int) {
      texImage.assetTexelComponentType = ComponentType::Int16;
    } else if (imgret.image.format == Image::PixelFormat::Float) {
      texImage.assetTexelComponentType = ComponentType::Half;
    } else {
      if (err) {
        (*err) += "Invalid image.pixelformat: " + tinyusdz::to_string(imgret.image.format) + "\n";
      }
      return false;
    }

  } else if (imgret.image.bpp == 16) {
    if (imgret.image.format == Image::PixelFormat::UInt) {
      texImage.assetTexelComponentType = ComponentType::UInt32;
    } else if (imgret.image.format == Image::PixelFormat::Int) {
      texImage.assetTexelComponentType = ComponentType::Int32;
    } else if (imgret.image.format == Image::PixelFormat::Float) {
      texImage.assetTexelComponentType = ComponentType::Float;
    } else {
      if (err) {
        (*err) += "Invalid image.pixelformat: " + tinyusdz::to_string(imgret.image.format) + "\n";
      }
      return false;
    }
  } else {
    DCOUT("TODO: bpp = " << result.value().image.bpp);
    if (err) {
      (*err) += "TODO or unsupported bpp: " +
               std::to_string(result.value().image.bpp) + "\n";
    }
    return false;
  }

  texImage.channels = result.value().image.channels;
  texImage.width = result.value().image.width;
  texImage.height = result.value().image.height;

  (*texImageOut) = texImage;

  // raw image data
  (*imageData) = result.value().image.data;

  return true;
}